

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeConstraint::updateHeightRange(ShapeConstraint *this,ShapeRange *other)

{
  string err;
  runtime_error *e;
  ShapeRange local_38;
  ShapeRange *local_18;
  ShapeRange *other_local;
  ShapeConstraint *this_local;
  
  local_18 = other;
  other_local = &this->_sequenceRange;
  ShapeRange::intersect(&local_38,&this->_heightRange,other);
  (this->_heightRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_heightRange)._minimum._val = local_38._minimum._val;
  (this->_heightRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_heightRange)._maximum._val = local_38._maximum._val;
  return;
}

Assistant:

void ShapeConstraint::updateHeightRange(const ShapeRange& other) {
    try {
        _heightRange = _heightRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid height range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}